

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorykeyvaluestore.cpp
# Opt level: O0

Set __thiscall
groundupdbext::MemoryKeyValueStore::getKeyValueSet(MemoryKeyValueStore *this,HashedValue *key)

{
  bool bVar1;
  pointer pIVar2;
  unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_> *this_00;
  pointer pKVar3;
  pointer ppVar4;
  iterator *in_RDX;
  _Node_iterator_base<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_false>
  *local_28;
  iterator *v;
  HashedValue *key_local;
  MemoryKeyValueStore *this_local;
  
  v = in_RDX;
  key_local = key;
  this_local = this;
  pIVar2 = std::
           unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ::operator->((unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
                         *)&key->m_has_value);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>,_groundupdbext::HighwayHash,_std::equal_to<groundupdb::HashedValue>,_std::allocator<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>_>_>
       ::find(&pIVar2->m_listStore,(key_type *)v);
  local_28 = &local_30;
  pIVar2 = std::
           unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
           ::operator->((unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
                         *)&key->m_has_value);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>,_groundupdbext::HighwayHash,_std::equal_to<groundupdb::HashedValue>,_std::allocator<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>_>_>
       ::end(&pIVar2->m_listStore);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (bVar1) {
    pIVar2 = std::
             unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
             ::operator->((unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
                           *)&key->m_has_value);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&pIVar2->m_cachedStore);
    if (bVar1) {
      pIVar2 = std::
               unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
               ::operator->((unique_ptr<groundupdbext::MemoryKeyValueStore::Impl,_std::default_delete<groundupdbext::MemoryKeyValueStore::Impl>_>
                             *)&key->m_has_value);
      this_00 = std::
                optional<std::unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>_>
                ::operator->(&pIVar2->m_cachedStore);
      pKVar3 = std::
               unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
               ::get(this_00);
      (*(pKVar3->super_Store)._vptr_Store[5])(this,pKVar3,v);
    }
    else {
      std::
      make_unique<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>>
                ();
    }
  }
  else {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_false,_false>
             ::operator->((_Node_iterator<std::pair<const_groundupdb::HashedValue,_std::unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>_>,_false,_false>
                           *)local_28);
    std::
    unique_ptr<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>_>
    ::operator*(&ppVar4->second);
    std::
    make_unique<std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>,std::unordered_set<groundupdb::EncodedValue,std::hash<groundupdb::EncodedValue>,std::equal_to<groundupdb::EncodedValue>,std::allocator<groundupdb::EncodedValue>>&>
              ((unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>
                *)this);
  }
  return (__uniq_ptr_data<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>,_true,_true>
          )(__uniq_ptr_data<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>,_std::default_delete<std::unordered_set<groundupdb::EncodedValue,_std::hash<groundupdb::EncodedValue>,_std::equal_to<groundupdb::EncodedValue>,_std::allocator<groundupdb::EncodedValue>_>_>,_true,_true>
            )this;
}

Assistant:

Set
MemoryKeyValueStore::getKeyValueSet(const HashedValue& key) {
  const auto& v = mImpl->m_listStore.find(key);
  //std::cout << "MEMKVS: getKeyValueSet" << std::endl;
  if (v == mImpl->m_listStore.end()) {
    //std::cout << "  MEMKVS: not found in memory" << std::endl;
    // try underlying store first
    if (mImpl->m_cachedStore) {
      //std::cout << "  MEMKVS: checking underlying store we're caching for and returning" << std::endl;
      return mImpl->m_cachedStore->get()->getKeyValueSet(key);
    }
    //std::cout << "  MEMKVS: Returning empty value" << std::endl;
    return std::make_unique<std::unordered_set<EncodedValue>>(); // copy ctor
  }
  //std::cout << "  MEMKVS: returning Set with size: " << v->second->size() << std::endl;
  // Note we dereference the below because v->second is an unorderedmap hashedvalue wrapper, and not the Set value itself
  return std::make_unique<std::unordered_set<EncodedValue>>(*(v->second)); // copy ctor
}